

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  int field_number;
  bool bVar1;
  int iVar2;
  int size;
  undefined4 extraout_var;
  ulong uVar3;
  void *data;
  undefined1 local_160 [8];
  CodedOutputStream coded_output;
  StringOutputStream output_stream;
  undefined1 local_128 [4];
  uint32 length;
  string temp;
  CodedInputStream sub_input;
  ArrayInputStream raw_input;
  uint32 type_id;
  undefined1 local_78 [4];
  uint32 tag;
  string message_data;
  FieldDescriptor *field;
  uint32 last_type_id;
  Reflection *message_reflection;
  Message *message_local;
  CodedInputStream *input_local;
  uint32 local_1c;
  uint32 v;
  uint32 local_c;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  field._4_4_ = 0;
  message_data.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_78);
  do {
    do {
      while( true ) {
        local_1c = 0;
        if ((input->buffer_ < input->buffer_end_) &&
           (local_1c = (uint32)*input->buffer_, local_1c < 0x80)) {
          input->last_tag_ = local_1c;
          io::CodedInputStream::Advance(input,1);
          local_c = local_1c;
        }
        else {
          local_c = io::CodedInputStream::ReadTagFallback(input,local_1c);
          input->last_tag_ = local_c;
        }
        if (local_c == 0) {
          input_local._7_1_ = 0;
          goto LAB_005aecbc;
        }
        if (local_c == 0xc) {
          input_local._7_1_ = 1;
          goto LAB_005aecbc;
        }
        if (local_c == 0x10) break;
        if (local_c == 0x1a) {
          if (field._4_4_ == 0) {
            std::__cxx11::string::string((string *)local_128);
            bVar1 = io::CodedInputStream::ReadVarint32
                              (input,(uint32 *)((long)&output_stream.target_ + 4));
            if (bVar1) {
              bVar1 = io::CodedInputStream::ReadString
                                (input,(string *)local_128,output_stream.target_._4_4_);
              if (bVar1) {
                io::StringOutputStream::StringOutputStream
                          ((StringOutputStream *)&coded_output.had_error_,(string *)local_78);
                io::CodedOutputStream::CodedOutputStream
                          ((CodedOutputStream *)local_160,
                           (ZeroCopyOutputStream *)&coded_output.had_error_);
                io::CodedOutputStream::WriteVarint32
                          ((CodedOutputStream *)local_160,output_stream.target_._4_4_);
                io::CodedOutputStream::WriteString
                          ((CodedOutputStream *)local_160,(string *)local_128);
                io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_160);
                io::StringOutputStream::~StringOutputStream
                          ((StringOutputStream *)&coded_output.had_error_);
                bVar1 = false;
              }
              else {
                input_local._7_1_ = 0;
                bVar1 = true;
              }
            }
            else {
              input_local._7_1_ = 0;
              bVar1 = true;
            }
            std::__cxx11::string::~string((string *)local_128);
            if (bVar1) goto LAB_005aecbc;
          }
          else {
            bVar1 = ParseAndMergeMessageSetField
                              (field._4_4_,(FieldDescriptor *)message_data.field_2._8_8_,message,
                               input);
            if (!bVar1) {
              input_local._7_1_ = 0;
              goto LAB_005aecbc;
            }
          }
        }
        else {
          bVar1 = SkipField(input,local_c,(UnknownFieldSet *)0x0);
          if (!bVar1) {
            input_local._7_1_ = 0;
            goto LAB_005aecbc;
          }
        }
      }
      bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&raw_input.last_returned_size_);
      field_number = raw_input.last_returned_size_;
      if (!bVar1) {
        input_local._7_1_ = 0;
        goto LAB_005aecbc;
      }
      field._4_4_ = raw_input.last_returned_size_;
      message_data.field_2._8_8_ =
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x270))
                     ((long *)CONCAT44(extraout_var,iVar2),raw_input.last_returned_size_);
      uVar3 = std::__cxx11::string::empty();
    } while ((uVar3 & 1) != 0);
    data = (void *)std::__cxx11::string::data();
    size = std::__cxx11::string::size();
    io::ArrayInputStream::ArrayInputStream
              ((ArrayInputStream *)&sub_input.extension_factory_,data,size,-1);
    io::CodedInputStream::CodedInputStream
              ((CodedInputStream *)((long)&temp.field_2 + 8),
               (ZeroCopyInputStream *)&sub_input.extension_factory_);
    bVar1 = ParseAndMergeMessageSetField
                      (field_number,(FieldDescriptor *)message_data.field_2._8_8_,message,
                       (CodedInputStream *)((long)&temp.field_2 + 8));
    if (bVar1) {
      std::__cxx11::string::clear();
    }
    else {
      input_local._7_1_ = 0;
    }
    io::CodedInputStream::~CodedInputStream((CodedInputStream *)((long)&temp.field_2 + 8));
    io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&sub_input.extension_factory_);
  } while (bVar1);
LAB_005aecbc:
  std::__cxx11::string::~string((string *)local_78);
  return (bool)(input_local._7_1_ & 1);
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(
    io::CodedInputStream* input,
    Message* message) {
  const Reflection* message_reflection = message->GetReflection();

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  uint32 last_type_id = 0;

  // Once we see a type_id, we'll look up the FieldDescriptor for the
  // extension.
  const FieldDescriptor* field = NULL;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        last_type_id = type_id;
        field = message_reflection->FindKnownExtensionByNumber(type_id);

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::ArrayInputStream raw_input(message_data.data(),
                                         message_data.size());
          io::CodedInputStream sub_input(&raw_input);
          if (!ParseAndMergeMessageSetField(last_type_id, field, message,
                                            &sub_input)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (last_type_id == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseAndMergeMessageSetField(last_type_id, field, message,
                                            input)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!SkipField(input, tag, NULL)) return false;
      }
    }
  }
}